

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

string * httplib::detail::if2ip(string *__return_storage_ptr__,int address_family,string *ifn)

{
  ushort *puVar1;
  bool bVar2;
  uint uVar3;
  char *pcVar4;
  long *plVar5;
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  char acStack_88 [8];
  char buf [16];
  undefined1 local_5a [2];
  size_type *local_58;
  string addr_candidate;
  ifaddrs *ifap;
  
  plVar5 = (long *)((long)&addr_candidate.field_2 + 8);
  getifaddrs(plVar5);
  local_58 = &addr_candidate._M_string_length;
  addr_candidate._M_dataplus._M_p = (pointer)0x0;
  addr_candidate._M_string_length._0_1_ = 0;
  do {
    do {
      while( true ) {
        do {
          do {
            do {
              plVar5 = (long *)*plVar5;
              if (plVar5 == (long *)0x0) {
                freeifaddrs(addr_candidate.field_2._8_8_);
                (__return_storage_ptr__->_M_dataplus)._M_p =
                     (pointer)&__return_storage_ptr__->field_2;
                if (local_58 == &addr_candidate._M_string_length) {
                  (__return_storage_ptr__->field_2)._M_allocated_capacity =
                       CONCAT71(addr_candidate._M_string_length._1_7_,
                                (undefined1)addr_candidate._M_string_length);
                  *(size_type *)((long)&__return_storage_ptr__->field_2 + 8) =
                       addr_candidate.field_2._M_allocated_capacity;
                }
                else {
                  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
                  (__return_storage_ptr__->field_2)._M_allocated_capacity =
                       CONCAT71(addr_candidate._M_string_length._1_7_,
                                (undefined1)addr_candidate._M_string_length);
                }
                __return_storage_ptr__->_M_string_length =
                     (size_type)addr_candidate._M_dataplus._M_p;
                addr_candidate._M_dataplus._M_p = (pointer)0x0;
                addr_candidate._M_string_length._0_1_ = 0;
                local_58 = &addr_candidate._M_string_length;
                goto LAB_0019403e;
              }
            } while (plVar5[3] == 0);
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)ifn,(char *)plVar5[1]);
          } while (!bVar2);
          puVar1 = (ushort *)plVar5[3];
          uVar3 = (uint)*puVar1;
        } while ((address_family != 0) && (uVar3 != address_family));
        if (uVar3 != 10) break;
        if ((*(uint *)(puVar1 + 4) & 0xc0ff) != 0x80fe) {
          buf[8] = '\0';
          buf[9] = '\0';
          buf[10] = '\0';
          buf[0xb] = '\0';
          buf[0xc] = '\0';
          buf[0xd] = '\0';
          buf[0xe] = '\0';
          buf[0xf] = '\0';
          acStack_88[0] = '\0';
          acStack_88[1] = '\0';
          acStack_88[2] = '\0';
          acStack_88[3] = '\0';
          acStack_88[4] = '\0';
          acStack_88[5] = '\0';
          acStack_88[6] = '\0';
          acStack_88[7] = '\0';
          buf[0] = '\0';
          buf[1] = '\0';
          buf[2] = '\0';
          buf[3] = '\0';
          buf[4] = '\0';
          buf[5] = '\0';
          buf[6] = '\0';
          buf[7] = '\0';
          pcVar4 = inet_ntop(10,puVar1 + 4,acStack_88,0x2e);
          if (pcVar4 != (char *)0x0) {
            if ((puVar1[4] & 0xfe) != 0xfc) {
              freeifaddrs(addr_candidate.field_2._8_8_);
              (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2
              ;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)__return_storage_ptr__,acStack_88,local_5a);
              goto LAB_0019403e;
            }
            local_a8[0] = local_98;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,acStack_88,local_5a);
            std::__cxx11::string::operator=((string *)&local_58,(string *)local_a8);
            std::__cxx11::string::~string((string *)local_a8);
          }
        }
      }
    } while (uVar3 != 2);
    pcVar4 = inet_ntop(2,puVar1 + 2,acStack_88,0x10);
  } while (pcVar4 == (char *)0x0);
  freeifaddrs(addr_candidate.field_2._8_8_);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,acStack_88,buf + 8);
LAB_0019403e:
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

inline std::string if2ip(int address_family, const std::string& ifn) {
            struct ifaddrs* ifap;
            getifaddrs(&ifap);
            std::string addr_candidate;
            for (auto ifa = ifap; ifa; ifa = ifa->ifa_next) {
                if (ifa->ifa_addr && ifn == ifa->ifa_name &&
                    (AF_UNSPEC == address_family ||
                        ifa->ifa_addr->sa_family == address_family)) {
                    if (ifa->ifa_addr->sa_family == AF_INET) {
                        auto sa = reinterpret_cast<struct sockaddr_in*>(ifa->ifa_addr);
                        char buf[INET_ADDRSTRLEN];
                        if (inet_ntop(AF_INET, &sa->sin_addr, buf, INET_ADDRSTRLEN)) {
                            freeifaddrs(ifap);
                            return std::string(buf, INET_ADDRSTRLEN);
                        }
                    } else if (ifa->ifa_addr->sa_family == AF_INET6) {
                        auto sa = reinterpret_cast<struct sockaddr_in6*>(ifa->ifa_addr);
                        if (!IN6_IS_ADDR_LINKLOCAL(&sa->sin6_addr)) {
                            char buf[INET6_ADDRSTRLEN] = {};
                            if (inet_ntop(AF_INET6, &sa->sin6_addr, buf, INET6_ADDRSTRLEN)) {
                                // equivalent to mac's IN6_IS_ADDR_UNIQUE_LOCAL
                                auto s6_addr_head = sa->sin6_addr.s6_addr[0];
                                if (s6_addr_head == 0xfc || s6_addr_head == 0xfd) {
                                    addr_candidate = std::string(buf, INET6_ADDRSTRLEN);
                                } else {
                                    freeifaddrs(ifap);
                                    return std::string(buf, INET6_ADDRSTRLEN);
                                }
                            }
                        }
                    }
                }
            }
            freeifaddrs(ifap);
            return addr_candidate;
        }